

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

uint __thiscall llvm::yaml::Output::beginFlowSequence(Output *this)

{
  StringRef local_28;
  InState local_14;
  Output *local_10;
  Output *this_local;
  
  local_14 = inFlowSeqFirstElement;
  local_10 = this;
  SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::push_back
            ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)&this->StateStack,
             &local_14);
  newLineCheck(this);
  this->ColumnAtFlowStart = this->Column;
  StringRef::StringRef(&local_28,"[ ");
  output(this,local_28);
  this->NeedFlowSequenceComma = false;
  return 0;
}

Assistant:

unsigned Output::beginFlowSequence() {
  StateStack.push_back(inFlowSeqFirstElement);
  newLineCheck();
  ColumnAtFlowStart = Column;
  output("[ ");
  NeedFlowSequenceComma = false;
  return 0;
}